

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

int ShGetUniformLocation(ShHandle handle,char *name)

{
  int iVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  
  if (handle != (ShHandle)0x0) {
    auVar3 = (**(code **)(*handle + 0x20))();
    plVar2 = auVar3._0_8_;
    if (plVar2 != (long *)0x0) {
      iVar1 = (**(code **)(*plVar2 + 0x30))(plVar2,name,auVar3._8_8_,*(code **)(*plVar2 + 0x30));
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int ShGetUniformLocation(const ShHandle handle, const char* name)
{
    if (handle == nullptr)
        return -1;

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(handle);
    TUniformMap* uniformMap= base->getAsUniformMap();
    if (uniformMap == nullptr)
        return -1;

    return uniformMap->getLocation(name);
}